

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

DataDrop * __thiscall MixedArena::alloc<wasm::DataDrop>(MixedArena *this)

{
  DataDrop *pDVar1;
  
  pDVar1 = (DataDrop *)allocSpace(this,0x20,8);
  *(undefined8 *)&(pDVar1->super_SpecificExpression<(wasm::Expression::Id)37>).super_Expression =
       0x25;
  (pDVar1->super_SpecificExpression<(wasm::Expression::Id)37>).super_Expression.type.id = 0;
  (pDVar1->segment).super_IString.str._M_len = 0;
  (pDVar1->segment).super_IString.str._M_str = (char *)0x0;
  return pDVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }